

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O3

bool tcu::astc::anon_unknown_0::isValidBlockParams
               (NormalBlockParams *params,int blockWidth,int blockHeight)

{
  bool bVar1;
  ISEMode IVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  
  bVar1 = params->isDualPlane;
  iVar6 = params->weightGridHeight * params->weightGridWidth << (bVar1 & 0x1fU);
  IVar2 = (params->weightISEParams).mode;
  iVar10 = (params->weightISEParams).numBits;
  if (IVar2 == ISEMODE_PLAIN_BIT) {
    iVar4 = iVar6 * iVar10;
  }
  else {
    if (IVar2 == ISEMODE_QUINT) {
      iVar4 = iVar6 * iVar10 + (iVar6 * 7) / 3;
      bVar11 = iVar6 * -0x55555553 + 0x2aaaaaaaU < 0x55555555;
    }
    else {
      iVar4 = -1;
      if (IVar2 != ISEMODE_TRIT) goto LAB_00a9ef66;
      iVar4 = iVar6 * iVar10 + (iVar6 * 8) / 5;
      bVar11 = iVar6 * 0x66666668 + 0x19999999U < 0x33333333;
    }
    iVar4 = (iVar4 + 1) - (uint)bVar11;
  }
LAB_00a9ef66:
  uVar3 = params->numPartitions;
  if (params->isMultiPartSingleCemMode == false) {
    if ((int)uVar3 < 1) {
      iVar8 = 0;
    }
    else {
      uVar9 = 0;
      iVar8 = 0;
      do {
        iVar8 = iVar8 + (params->colorEndpointModes[uVar9] >> 2) * 2 + 2;
        uVar9 = uVar9 + 1;
      } while (uVar3 != uVar9);
    }
  }
  else {
    iVar8 = ((params->colorEndpointModes[0] >> 2) * 2 + 2) * uVar3;
  }
  if (IVar2 == ISEMODE_PLAIN_BIT) {
    iVar5 = iVar10 * iVar6;
  }
  else {
    if (IVar2 == ISEMODE_QUINT) {
      iVar5 = (iVar6 * 7) / 3;
      bVar11 = iVar6 * -0x55555553 + 0x2aaaaaaaU < 0x55555555;
    }
    else {
      iVar5 = -1;
      if (IVar2 != ISEMODE_TRIT) goto LAB_00a9f04d;
      iVar5 = (iVar6 * 8) / 5;
      bVar11 = iVar6 * 0x66666668 + 0x19999999U < 0x33333333;
    }
    iVar5 = ((iVar5 + 1) - (uint)bVar11) + iVar10 * iVar6;
  }
LAB_00a9f04d:
  iVar10 = -0x1d;
  if (params->isMultiPartSingleCemMode == false) {
    iVar10 = uVar3 * -3 + -0x19;
  }
  iVar7 = -0x11;
  if ((ulong)uVar3 != 1) {
    iVar7 = iVar10;
  }
  if ((iVar6 < 0x41) &&
     ((params->weightGridHeight <= blockHeight && params->weightGridWidth <= blockWidth) &&
      0xffffffb6 < iVar4 - 0x61U)) {
    if (uVar3 == 4) {
      if (iVar8 < 0x13 && bVar1 == false) {
LAB_00a9f0be:
        return (int)(((iVar8 * 0xd) / 5 + 1) - (uint)(iVar8 * 0x66666669 + 0x19999999U < 0x33333333)
                    ) <= (int)(((iVar7 + (uint)(bVar1 ^ 1) * 2) - iVar5) + 0x7e);
      }
    }
    else if (iVar8 < 0x13) goto LAB_00a9f0be;
  }
  return false;
}

Assistant:

static inline int computeNumWeights (const NormalBlockParams& params)
{
	return params.weightGridWidth * params.weightGridHeight * (params.isDualPlane ? 2 : 1);
}